

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

int __thiscall
alex::
AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>::
insert_using_shifts(AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
                    *this,double *key,double payload,int pos)

{
  int iVar1;
  int in_EDX;
  double *in_RSI;
  AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *in_RDI;
  AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *in_XMM0_Qa;
  int i_1;
  int i;
  int gap_pos;
  int in_stack_0000004c;
  AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *in_stack_00000050;
  int local_30;
  int local_2c;
  AlexDataNode<double,_double,_alex::AlexCompare,_std::allocator<std::pair<double,_double>_>,_true>
  *this_00;
  int local_4;
  
  this_00 = in_RDI;
  iVar1 = closest_gap(in_stack_00000050,in_stack_0000004c);
  set_bit(in_XMM0_Qa,in_EDX);
  local_30 = iVar1;
  local_2c = iVar1;
  if (iVar1 < in_EDX) {
    for (; local_30 < in_EDX + -1; local_30 = local_30 + 1) {
      in_RDI->key_slots_[local_30] = in_RDI->key_slots_[local_30 + 1];
      in_RDI->payload_slots_[local_30] = in_RDI->payload_slots_[local_30 + 1];
    }
    insert_element_at(this_00,in_RSI,(double)in_XMM0_Qa,in_EDX);
    in_RDI->num_shifts_ = (long)((in_EDX - iVar1) + -1) + in_RDI->num_shifts_;
    local_4 = in_EDX + -1;
  }
  else {
    for (; in_EDX < local_2c; local_2c = local_2c + -1) {
      in_RDI->key_slots_[local_2c] = in_RDI->key_slots_[local_2c + -1];
      in_RDI->payload_slots_[local_2c] = in_RDI->payload_slots_[local_2c + -1];
    }
    insert_element_at(this_00,in_RSI,(double)in_XMM0_Qa,in_EDX);
    in_RDI->num_shifts_ = (long)(iVar1 - in_EDX) + in_RDI->num_shifts_;
    local_4 = in_EDX;
  }
  return local_4;
}

Assistant:

int insert_using_shifts(const T& key, P payload, int pos) {
    // Find the closest gap
    int gap_pos = closest_gap(pos);
    set_bit(gap_pos);
    if (gap_pos >= pos) {
      for (int i = gap_pos; i > pos; i--) {
#if ALEX_DATA_NODE_SEP_ARRAYS
        key_slots_[i] = key_slots_[i - 1];
        payload_slots_[i] = payload_slots_[i - 1];
#else
        data_slots_[i] = data_slots_[i - 1];
#endif
      }
      insert_element_at(key, payload, pos);
      num_shifts_ += gap_pos - pos;
      return pos;
    } else {
      for (int i = gap_pos; i < pos - 1; i++) {
#if ALEX_DATA_NODE_SEP_ARRAYS
        key_slots_[i] = key_slots_[i + 1];
        payload_slots_[i] = payload_slots_[i + 1];
#else
        data_slots_[i] = data_slots_[i + 1];
#endif
      }
      insert_element_at(key, payload, pos - 1);
      num_shifts_ += pos - gap_pos - 1;
      return pos - 1;
    }
  }